

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_context.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  void *__ptr;
  FILE *fp;
  int outer;
  int inner;
  void *base;
  void *prealloc;
  secp256k1_ecmult_gen_context ctx;
  char **argv_local;
  int argc_local;
  
  ctx.initial._120_8_ = argv;
  __stream = fopen("src/ecmult_static_context.h","w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Could not open src/ecmult_static_context.h for writing!\n");
    argv_local._4_4_ = -1;
  }
  else {
    fprintf(__stream,"#ifndef _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(__stream,"#define _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(__stream,"#include \"src/group.h\"\n");
    fprintf(__stream,"#define SC SECP256K1_GE_STORAGE_CONST\n");
    fprintf(__stream,"#if ECMULT_GEN_PREC_N != %d || ECMULT_GEN_PREC_G != %d\n",0x40,0x10);
    fprintf(__stream,
            "   #error configuration mismatch, invalid ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G. Try deleting ecmult_static_context.h before the build.\n"
           );
    fprintf(__stream,"#endif\n");
    fprintf(__stream,
            "static const secp256k1_ge_storage secp256k1_ecmult_static_context[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G] = {\n"
           );
    __ptr = checked_malloc(&default_error_callback,0x10000);
    base = __ptr;
    secp256k1_ecmult_gen_context_init((secp256k1_ecmult_gen_context *)&prealloc);
    secp256k1_ecmult_gen_context_build((secp256k1_ecmult_gen_context *)&prealloc,&base);
    for (fp._0_4_ = 0; (int)fp != 0x40; fp._0_4_ = (int)fp + 1) {
      fprintf(__stream,"{\n");
      for (fp._4_4_ = 0; fp._4_4_ != 0x10; fp._4_4_ = fp._4_4_ + 1) {
        fprintf(__stream,
                "    SC(%uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu)"
                ,*(ulong *)((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x18)
                 >> 0x20,*(ulong *)((long)prealloc +
                                   (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x18) &
                         0xffffffff,
                *(ulong *)((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x10) >>
                0x20,*(ulong *)((long)prealloc +
                               (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x10) & 0xffffffff,
                (int)((ulong)*(undefined8 *)
                              ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 8)
                     >> 0x20),
                (int)*(undefined8 *)
                      ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 8),
                (int)((ulong)*(undefined8 *)
                              ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400) >>
                     0x20),
                (int)*(undefined8 *)((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400)
                ,(int)((ulong)*(undefined8 *)
                               ((long)prealloc +
                               (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x38) >> 0x20),
                (int)*(undefined8 *)
                      ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x38),
                (int)((ulong)*(undefined8 *)
                              ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x30
                              ) >> 0x20),
                (int)*(undefined8 *)
                      ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x30),
                (int)((ulong)*(undefined8 *)
                              ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x28
                              ) >> 0x20),
                (int)*(undefined8 *)
                      ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x28),
                (int)((ulong)*(undefined8 *)
                              ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x20
                              ) >> 0x20),
                (int)*(undefined8 *)
                      ((long)prealloc + (long)fp._4_4_ * 0x40 + (long)(int)fp * 0x400 + 0x20));
        if (fp._4_4_ == 0xf) {
          fprintf(__stream,"\n");
        }
        else {
          fprintf(__stream,",\n");
        }
      }
      if ((int)fp == 0x3f) {
        fprintf(__stream,"}\n");
      }
      else {
        fprintf(__stream,"},\n");
      }
    }
    fprintf(__stream,"};\n");
    secp256k1_ecmult_gen_context_clear((secp256k1_ecmult_gen_context *)&prealloc);
    free(__ptr);
    fprintf(__stream,"#undef SC\n");
    fprintf(__stream,"#endif\n");
    fclose(__stream);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    secp256k1_ecmult_gen_context ctx;
    void *prealloc, *base;
    int inner;
    int outer;
    FILE* fp;

    (void)argc;
    (void)argv;

    fp = fopen("src/ecmult_static_context.h","w");
    if (fp == NULL) {
        fprintf(stderr, "Could not open src/ecmult_static_context.h for writing!\n");
        return -1;
    }

    fprintf(fp, "#ifndef _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(fp, "#define _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(fp, "#include \"src/group.h\"\n");
    fprintf(fp, "#define SC SECP256K1_GE_STORAGE_CONST\n");
    fprintf(fp, "#if ECMULT_GEN_PREC_N != %d || ECMULT_GEN_PREC_G != %d\n", ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G);
    fprintf(fp, "   #error configuration mismatch, invalid ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G. Try deleting ecmult_static_context.h before the build.\n");
    fprintf(fp, "#endif\n");
    fprintf(fp, "static const secp256k1_ge_storage secp256k1_ecmult_static_context[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G] = {\n");

    base = checked_malloc(&default_error_callback, SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE);
    prealloc = base;
    secp256k1_ecmult_gen_context_init(&ctx);
    secp256k1_ecmult_gen_context_build(&ctx, &prealloc);
    for(outer = 0; outer != ECMULT_GEN_PREC_N; outer++) {
        fprintf(fp,"{\n");
        for(inner = 0; inner != ECMULT_GEN_PREC_G; inner++) {
            fprintf(fp,"    SC(%uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu)", SECP256K1_GE_STORAGE_CONST_GET((*ctx.prec)[outer][inner]));
            if (inner != ECMULT_GEN_PREC_G - 1) {
                fprintf(fp,",\n");
            } else {
                fprintf(fp,"\n");
            }
        }
        if (outer != ECMULT_GEN_PREC_N - 1) {
            fprintf(fp,"},\n");
        } else {
            fprintf(fp,"}\n");
        }
    }
    fprintf(fp,"};\n");
    secp256k1_ecmult_gen_context_clear(&ctx);
    free(base);

    fprintf(fp, "#undef SC\n");
    fprintf(fp, "#endif\n");
    fclose(fp);

    return 0;
}